

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O2

Gia_Man_t *
Gia_ManSpecReduce(Gia_Man_t *p,int fDualOut,int fSynthesis,int fSpeculate,int fSkipSome,int fVerbose
                 )

{
  Vec_Int_t *vTrace_00;
  int iVar1;
  uint uVar2;
  int iVar3;
  Vec_Int_t *vTrace_01;
  Gia_Man_t *pGVar4;
  Vec_Int_t *p_00;
  char *pcVar5;
  Gia_Obj_t *pGVar6;
  Gia_Man_t *pGVar7;
  int iVar8;
  Vec_Int_t *vGuide;
  Vec_Int_t *vTrace;
  
  vTrace = (Vec_Int_t *)0x0;
  vGuide = (Vec_Int_t *)0x0;
  if (p->pReprs == (Gia_Rpr_t *)0x0) {
    pcVar5 = "Gia_ManSpecReduce(): Equivalence classes are not available.\n";
  }
  else {
    if ((fDualOut == 0) || ((p->vCos->nSize - p->nRegs & 1U) == 0)) {
      if (fSkipSome == 0) {
        vTrace_01 = (Vec_Int_t *)0x0;
      }
      else {
        vTrace_01 = Vec_IntAlloc(100);
        vGuide = vTrace_01;
        pGVar4 = Gia_ManSpecReduceTrace(p,vTrace_01,(Vec_Int_t *)0x0);
        Gia_ManStop(pGVar4);
        iVar8 = vTrace_01->nSize;
        iVar1 = Gia_ManEquivCountLitsAll(p);
        if (iVar8 != iVar1) {
          __assert_fail("Vec_IntSize(vGuide) == Gia_ManEquivCountLitsAll(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                        ,0x4be,"Gia_Man_t *Gia_ManSpecReduce(Gia_Man_t *, int, int, int, int, int)")
          ;
        }
        vTrace = Vec_IntAlloc(100);
      }
      vTrace_00 = vTrace;
      p_00 = Vec_IntAlloc(1000);
      Gia_ManSetPhase(p);
      Gia_ManFillValue(p);
      if (fDualOut != 0) {
        Gia_ManEquivSetColors(p,fVerbose);
      }
      pGVar4 = Gia_ManStart(p->nObjs);
      pcVar5 = Abc_UtilStrsav(p->pName);
      pGVar4->pName = pcVar5;
      pcVar5 = Abc_UtilStrsav(p->pSpec);
      pGVar4->pSpec = pcVar5;
      Gia_ManHashAlloc(pGVar4);
      p->pObjs->Value = 0;
      iVar8 = 0;
      while ((iVar8 < p->vCis->nSize && (pGVar6 = Gia_ManCi(p,iVar8), pGVar6 != (Gia_Obj_t *)0x0)))
      {
        uVar2 = Gia_ManAppendCi(pGVar4);
        pGVar6->Value = uVar2;
        iVar8 = iVar8 + 1;
      }
      iVar8 = 0;
      while ((iVar8 < p->nRegs &&
             (pGVar6 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar8), pGVar6 != (Gia_Obj_t *)0x0)
             )) {
        Gia_ManSpecBuild(pGVar4,p,pGVar6,p_00,fDualOut,fSpeculate,vTrace_00,vTrace_01,
                         (Vec_Int_t *)0x0);
        iVar8 = iVar8 + 1;
      }
      iVar8 = 0;
      while ((iVar8 < p->vCos->nSize && (pGVar6 = Gia_ManCo(p,iVar8), pGVar6 != (Gia_Obj_t *)0x0)))
      {
        Gia_ManSpecReduce_rec
                  (pGVar4,p,pGVar6 + -(ulong)((uint)*(undefined8 *)pGVar6 & 0x1fffffff),p_00,
                   fDualOut,fSpeculate,vTrace_00,vTrace_01,(Vec_Int_t *)0x0);
        iVar8 = iVar8 + 1;
      }
      if (fSynthesis == 0) {
        iVar8 = 0;
        while ((iVar8 < p->vCos->nSize - p->nRegs &&
               (pGVar6 = Gia_ManCo(p,iVar8), pGVar6 != (Gia_Obj_t *)0x0))) {
          iVar1 = Gia_ObjFanin0Copy(pGVar6);
          Gia_ManAppendCo(pGVar4,iVar1);
          iVar8 = iVar8 + 1;
        }
      }
      for (iVar8 = 0; iVar8 < p_00->nSize; iVar8 = iVar8 + 1) {
        iVar1 = Vec_IntEntry(p_00,iVar8);
        Gia_ManAppendCo(pGVar4,iVar1);
      }
      if (p_00->nSize == 0) {
        Abc_Print(1,"Speculatively reduced model has no primary outputs.\n");
        Gia_ManAppendCo(pGVar4,0);
      }
      iVar8 = 0;
      while ((iVar8 < p->nRegs &&
             (pGVar6 = Gia_ManCo(p,(p->vCos->nSize - p->nRegs) + iVar8), pGVar6 != (Gia_Obj_t *)0x0)
             )) {
        iVar1 = Gia_ObjFanin0Copy(pGVar6);
        Gia_ManAppendCo(pGVar4,iVar1);
        iVar8 = iVar8 + 1;
      }
      Gia_ManHashStop(pGVar4);
      Vec_IntFree(p_00);
      Gia_ManSetRegNum(pGVar4,p->nRegs);
      pGVar7 = Gia_ManCleanup(pGVar4);
      Gia_ManStop(pGVar4);
      if (fSkipSome != 0) {
        iVar1 = 0;
        for (iVar8 = 0; iVar8 < vTrace_01->nSize; iVar8 = iVar8 + 1) {
          iVar3 = Vec_IntEntry(vTrace_01,iVar8);
          iVar1 = (iVar1 + 1) - (uint)(iVar3 == 0);
        }
        if ((iVar1 != 0) &&
           (pGVar7->vCos->nSize - pGVar7->nRegs != (iVar1 + p->vCos->nSize) - p->nRegs)) {
          __assert_fail("Gia_ManPoNum(pNew) == Gia_ManPoNum(p) + nAddPos",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                        ,0x4ee,"Gia_Man_t *Gia_ManSpecReduce(Gia_Man_t *, int, int, int, int, int)")
          ;
        }
      }
      Vec_IntFreeP(&vTrace);
      Vec_IntFreeP(&vGuide);
      return pGVar7;
    }
    pcVar5 = "Gia_ManSpecReduce(): Dual-output miter should have even number of POs.\n";
  }
  Abc_Print(1,pcVar5);
  return (Gia_Man_t *)0x0;
}

Assistant:

Gia_Man_t * Gia_ManSpecReduce( Gia_Man_t * p, int fDualOut, int fSynthesis, int fSpeculate, int fSkipSome, int fVerbose )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    Vec_Int_t * vXorLits;
    int i, iLitNew;
    Vec_Int_t * vTrace = NULL, * vGuide = NULL;
    if ( !p->pReprs )
    {
        Abc_Print( 1, "Gia_ManSpecReduce(): Equivalence classes are not available.\n" );
        return NULL;
    }
    if ( fDualOut && (Gia_ManPoNum(p) & 1) )
    {
        Abc_Print( 1, "Gia_ManSpecReduce(): Dual-output miter should have even number of POs.\n" );
        return NULL;
    }
    if ( fSkipSome )
    {
        vGuide = Vec_IntAlloc( 100 );
        pTemp  = Gia_ManSpecReduceTrace( p, vGuide, NULL );
        Gia_ManStop( pTemp );
        assert( Vec_IntSize(vGuide) == Gia_ManEquivCountLitsAll(p) );
        vTrace = Vec_IntAlloc( 100 );
    }
    vXorLits = Vec_IntAlloc( 1000 );
    Gia_ManSetPhase( p );
    Gia_ManFillValue( p );
    if ( fDualOut )
        Gia_ManEquivSetColors( p, fVerbose );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManForEachRo( p, pObj, i )
        Gia_ManSpecBuild( pNew, p, pObj, vXorLits, fDualOut, fSpeculate, vTrace, vGuide, NULL );
    Gia_ManForEachCo( p, pObj, i )
        Gia_ManSpecReduce_rec( pNew, p, Gia_ObjFanin0(pObj), vXorLits, fDualOut, fSpeculate, vTrace, vGuide, NULL );
    if ( !fSynthesis )
    {
        Gia_ManForEachPo( p, pObj, i )
            Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    }
    Vec_IntForEachEntry( vXorLits, iLitNew, i )
        Gia_ManAppendCo( pNew, iLitNew );
    if ( Vec_IntSize(vXorLits) == 0 )
    {
        Abc_Print( 1, "Speculatively reduced model has no primary outputs.\n" );
        Gia_ManAppendCo( pNew, 0 );
    }
    Gia_ManForEachRi( p, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManHashStop( pNew );
    Vec_IntFree( vXorLits );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );

    // update using trace
    if ( fSkipSome )
    {
        // count the number of non-zero entries
        int iLit, nAddPos = 0;
        Vec_IntForEachEntry( vGuide, iLit, i )
            if ( iLit )
                nAddPos++;
        if ( nAddPos )
            assert( Gia_ManPoNum(pNew) == Gia_ManPoNum(p) + nAddPos );
    }
    Vec_IntFreeP( &vTrace );
    Vec_IntFreeP( &vGuide );
    return pNew;
}